

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

TTypeList * __thiscall
glslang::TParseContext::recordStructCopy
          (TParseContext *this,TStructRecord *record,TType *originType,TType *tmpType)

{
  _Rb_tree_header *p_Var1;
  byte bVar2;
  byte bVar3;
  TStructRecord *this_00;
  TType *pTVar4;
  int iVar5;
  mapped_type *pmVar6;
  mapped_type *ppTVar7;
  _Base_ptr p_Var8;
  _Base_ptr *pp_Var9;
  _Base_ptr p_Var10;
  ulong uVar11;
  long lVar12;
  _Base_ptr p_Var13;
  ulong uVar14;
  TTypeList *originStruct;
  size_t tmpHash;
  long local_a0;
  _Base_ptr local_98;
  key_type local_90;
  TStructRecord *local_88;
  ulong local_80;
  TType *local_78;
  ulong local_70;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>
  local_68;
  
  iVar5 = (*tmpType->_vptr_TType[0x25])(tmpType);
  if ((char)iVar5 != '\0') {
    local_90 = 0;
    lVar12 = (long)(((tmpType->field_13).referentType)->qualifier).semanticName -
             *(long *)&((tmpType->field_13).referentType)->field_0x8;
    local_88 = record;
    if (lVar12 == 0) {
      uVar11 = 0;
    }
    else {
      lVar12 = lVar12 >> 5;
      local_80 = lVar12 + (ulong)(lVar12 == 0);
      local_a0 = 0;
      uVar11 = 0;
      uVar14 = 0;
      local_78 = originType;
      do {
        pTVar4 = local_78;
        iVar5 = (*local_78->_vptr_TType[0x25])(local_78);
        if ((char)iVar5 == '\0') goto LAB_004c33ef;
        lVar12 = *(long *)&((pTVar4->field_13).referentType)->field_0x8;
        local_70 = uVar11;
        if ((ulong)((long)(((pTVar4->field_13).referentType)->qualifier).semanticName - lVar12 >> 5)
            <= uVar14) {
LAB_004c340e:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar14);
        }
        lVar12 = (**(code **)(**(long **)(lVar12 + local_a0) + 0x50))();
        bVar2 = *(byte *)(lVar12 + 0x10);
        iVar5 = (*pTVar4->_vptr_TType[0x25])(pTVar4);
        if ((char)iVar5 == '\0') goto LAB_004c33ef;
        lVar12 = *(long *)&((pTVar4->field_13).referentType)->field_0x8;
        if ((ulong)((long)(((pTVar4->field_13).referentType)->qualifier).semanticName - lVar12 >> 5)
            <= uVar14) goto LAB_004c340e;
        lVar12 = (**(code **)(**(long **)(lVar12 + local_a0) + 0x50))();
        uVar11 = *(ulong *)(lVar12 + 8);
        iVar5 = (*tmpType->_vptr_TType[0x25])(tmpType);
        if ((char)iVar5 == '\0') goto LAB_004c33ef;
        lVar12 = *(long *)&((tmpType->field_13).referentType)->field_0x8;
        if ((ulong)((long)(((tmpType->field_13).referentType)->qualifier).semanticName - lVar12 >> 5
                   ) <= uVar14) goto LAB_004c340e;
        lVar12 = (**(code **)(**(long **)(lVar12 + local_a0) + 0x50))();
        bVar3 = *(byte *)(lVar12 + 0x10);
        iVar5 = (*tmpType->_vptr_TType[0x25])(tmpType);
        if ((char)iVar5 == '\0') goto LAB_004c33ef;
        lVar12 = *(long *)&((tmpType->field_13).referentType)->field_0x8;
        if ((ulong)((long)(((tmpType->field_13).referentType)->qualifier).semanticName - lVar12 >> 5
                   ) <= uVar14) goto LAB_004c340e;
        uVar11 = (uVar11 >> 0x3d) + (ulong)(bVar2 & 0xf) ^ local_70;
        lVar12 = (**(code **)(**(long **)(lVar12 + local_a0) + 0x50))();
        uVar11 = uVar11 * 2;
        local_90 = ((*(ulong *)(lVar12 + 8) >> 0x3d) + (ulong)(bVar3 & 0xf) ^ local_90) * 2;
        uVar14 = uVar14 + 1;
        local_a0 = local_a0 + 0x20;
        originType = local_78;
      } while (local_80 != uVar14);
    }
    iVar5 = (*originType->_vptr_TType[0x25])(originType);
    if ((char)iVar5 != '\0') {
      local_98 = (_Base_ptr)(originType->field_13).structure;
      iVar5 = (*tmpType->_vptr_TType[0x25])(tmpType);
      this_00 = local_88;
      if ((char)iVar5 != '\0') {
        if (uVar11 != local_90) {
          p_Var1 = &(local_88->_M_t)._M_impl.super__Rb_tree_header;
          p_Var8 = (local_88->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var13 = &p_Var1->_M_header;
          for (; p_Var8 != (_Base_ptr)0x0;
              p_Var8 = (&p_Var8->_M_left)[*(_Base_ptr *)(p_Var8 + 1) < local_98]) {
            if (*(_Base_ptr *)(p_Var8 + 1) >= local_98) {
              p_Var13 = p_Var8;
            }
          }
          p_Var8 = &p_Var1->_M_header;
          if (((_Rb_tree_header *)p_Var13 != p_Var1) &&
             (p_Var8 = p_Var13, local_98 < *(_Base_ptr *)(p_Var13 + 1))) {
            p_Var8 = &p_Var1->_M_header;
          }
          p_Var13 = (_Base_ptr)(tmpType->field_13).structure;
          if ((_Rb_tree_header *)p_Var8 == p_Var1) {
            local_68._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_68._M_impl.super__Rb_tree_header._M_header;
            local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_68._M_impl._0_8_ = 0;
            local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_68._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_68._M_impl.super__Rb_tree_header._M_header._M_left;
            pmVar6 = std::
                     map<const_glslang::TVector<glslang::TTypeLoc>_*,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>_>_>_>
                     ::operator[](local_88,(key_type *)&local_98);
            std::
            map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>
            ::operator=(pmVar6,(map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>
                                *)&local_68);
            std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>
            ::_M_erase(&local_68,
                       (_Link_type)local_68._M_impl.super__Rb_tree_header._M_header._M_parent);
          }
          else {
            pp_Var9 = &p_Var8[1]._M_left;
            p_Var10 = (_Base_ptr)pp_Var9;
            for (p_Var8 = p_Var8[1]._M_right; p_Var8 != (_Base_ptr)0x0;
                p_Var8 = (&p_Var8->_M_left)[*(ulong *)(p_Var8 + 1) < local_90]) {
              if (*(ulong *)(p_Var8 + 1) >= local_90) {
                p_Var10 = p_Var8;
              }
            }
            p_Var8 = (_Base_ptr)pp_Var9;
            if ((p_Var10 != (_Base_ptr)pp_Var9) &&
               (p_Var8 = p_Var10, local_90 < *(ulong *)(p_Var10 + 1))) {
              p_Var8 = (_Base_ptr)pp_Var9;
            }
            if (p_Var8 != (_Base_ptr)pp_Var9) {
              return (TTypeList *)p_Var8[1]._M_parent;
            }
          }
          pmVar6 = std::
                   map<const_glslang::TVector<glslang::TTypeLoc>_*,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>_>_>_>
                   ::operator[](this_00,(key_type *)&local_98);
          ppTVar7 = std::
                    map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>
                    ::operator[](pmVar6,&local_90);
          *ppTVar7 = (mapped_type)p_Var13;
          local_98 = p_Var13;
        }
        return (TTypeList *)local_98;
      }
    }
  }
LAB_004c33ef:
  __assert_fail("isStruct()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
}

Assistant:

const TTypeList* TParseContext::recordStructCopy(TStructRecord& record, const TType* originType, const TType* tmpType)
{
    size_t memberCount = tmpType->getStruct()->size();
    size_t originHash = 0, tmpHash = 0;
    std::hash<size_t> hasher;
    for (size_t i = 0; i < memberCount; i++) {
        size_t originMemberHash = hasher(originType->getStruct()->at(i).type->getQualifier().layoutPacking +
                                         originType->getStruct()->at(i).type->getQualifier().layoutMatrix);
        size_t tmpMemberHash = hasher(tmpType->getStruct()->at(i).type->getQualifier().layoutPacking +
                                      tmpType->getStruct()->at(i).type->getQualifier().layoutMatrix);
        originHash = hasher((originHash ^ originMemberHash) << 1);
        tmpHash = hasher((tmpHash ^ tmpMemberHash) << 1);
    }
    const TTypeList* originStruct = originType->getStruct();
    const TTypeList* tmpStruct = tmpType->getStruct();
    if (originHash != tmpHash) {
        auto fixRecords = record.find(originStruct);
        if (fixRecords != record.end()) {
            auto fixRecord = fixRecords->second.find(tmpHash);
            if (fixRecord != fixRecords->second.end()) {
                return fixRecord->second;
            } else {
                record[originStruct][tmpHash] = tmpStruct;
                return tmpStruct;
            }
        } else {
            record[originStruct] = std::map<size_t, const TTypeList*>();
            record[originStruct][tmpHash] = tmpStruct;
            return tmpStruct;
        }
    }
    return originStruct;
}